

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallProgramsCommand.cxx
# Opt level: O2

string * __thiscall
cmInstallProgramsCommand::FindInstallSource_abi_cxx11_
          (string *__return_storage_ptr__,cmInstallProgramsCommand *this,char *name)

{
  bool bVar1;
  size_type sVar2;
  string *psVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  size_type *psVar5;
  string ts;
  string local_60;
  string local_40;
  
  bVar1 = cmsys::SystemTools::FileIsFullPath(name);
  if (bVar1) {
LAB_001ea808:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,name,(allocator<char> *)&local_60);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,name,(allocator<char> *)&local_40);
  sVar2 = cmGeneratorExpression::Find(&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (sVar2 == 0) goto LAB_001ea808;
  psVar3 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
  std::__cxx11::string::string((string *)&local_60,(string *)psVar3);
  std::__cxx11::string::append((char *)&local_60);
  std::__cxx11::string::append((char *)&local_60);
  psVar3 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
  std::__cxx11::string::string((string *)&local_40,(string *)psVar3);
  std::__cxx11::string::append((char *)&local_40);
  std::__cxx11::string::append((char *)&local_40);
  bVar1 = cmsys::SystemTools::FileExists(&local_60);
  if (bVar1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
  else {
    bVar1 = cmsys::SystemTools::FileExists(&local_40);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (bVar1) {
      paVar4 = &local_40.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p == paVar4) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             local_40.field_2._M_allocated_capacity;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_40.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_40._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             local_40.field_2._M_allocated_capacity;
      }
      psVar3 = &local_40;
      goto LAB_001ea882;
    }
  }
  paVar4 = &local_60.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p == paVar4) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_60.field_2._M_allocated_capacity
    ;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_60.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_60._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_60.field_2._M_allocated_capacity
    ;
  }
  psVar3 = &local_60;
LAB_001ea882:
  psVar5 = &psVar3->_M_string_length;
  __return_storage_ptr__->_M_string_length = *psVar5;
  (((string *)(psVar5 + -1))->_M_dataplus)._M_p = (pointer)paVar4;
  *psVar5 = 0;
  paVar4->_M_local_buf[0] = '\0';
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallProgramsCommand::FindInstallSource(const char* name) const
{
  if (cmSystemTools::FileIsFullPath(name) ||
      cmGeneratorExpression::Find(name) == 0) {
    // This is a full path.
    return name;
  }

  // This is a relative path.
  std::string tb = this->Makefile->GetCurrentBinaryDirectory();
  tb += "/";
  tb += name;
  std::string ts = this->Makefile->GetCurrentSourceDirectory();
  ts += "/";
  ts += name;

  if (cmSystemTools::FileExists(tb)) {
    // The file exists in the binary tree.  Use it.
    return tb;
  }
  if (cmSystemTools::FileExists(ts)) {
    // The file exists in the source tree.  Use it.
    return ts;
  }
  // The file doesn't exist.  Assume it will be present in the
  // binary tree when the install occurs.
  return tb;
}